

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O0

bool __thiscall
cmCreateTestSourceList::InitialPass
          (cmCreateTestSourceList *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  size_type sVar6;
  reference pbVar7;
  ulong uVar8;
  char *pcVar9;
  reference pbVar10;
  char *outfile;
  cmSourceFile *pcVar11;
  const_reference pvVar12;
  allocator local_591;
  string local_590;
  allocator local_569;
  string local_568;
  cmSourceFile *local_548;
  cmSourceFile *sf_1;
  allocator local_531;
  string local_530;
  cmSourceFile *local_510;
  cmSourceFile *sf;
  string sourceListValue;
  undefined1 local_4e0 [6];
  bool res;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string local_3a8;
  string local_388 [8];
  string func_name_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_358;
  iterator j;
  string local_348 [4];
  int numTests;
  string functionMapCode;
  string local_308;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  undefined1 local_268 [8];
  string func_name;
  string local_240 [8];
  string forwardDeclareCode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  const_iterator testsBegin;
  string local_1f8;
  string local_1d8 [8];
  string configFile;
  undefined1 local_1b0 [8];
  string driver;
  string local_188;
  string local_168;
  char *local_148;
  char *sourceList;
  undefined8 local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  allocator local_121;
  string local_120;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  undefined4 local_f8;
  allocator local_f1;
  string local_f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string function;
  string extraInclude;
  const_iterator i;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCreateTestSourceList *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar6 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with wrong number of arguments.",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    extraInclude.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
    std::__cxx11::string::string((string *)(function.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)
               &tests.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c0);
    while( true ) {
      local_c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&extraInclude.field_2 + 8),&local_c8);
      if (!bVar3) break;
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&extraInclude.field_2 + 8));
      bVar3 = std::operator==(pbVar7,"EXTRA_INCLUDE");
      if (bVar3) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&extraInclude.field_2 + 8));
        local_d0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
        bVar3 = __gnu_cxx::operator==
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&extraInclude.field_2 + 8),&local_d0);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_f0,"incorrect arguments to EXTRA_INCLUDE",&local_f1);
          cmCommand::SetError(&this->super_cmCommand,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          this_local._7_1_ = 0;
          local_f8 = 1;
          goto LAB_004dd9bd;
        }
        std::__cxx11::string::operator=((string *)(function.field_2._M_local_buf + 8),"#include \"")
        ;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&extraInclude.field_2 + 8));
        std::__cxx11::string::operator+=
                  ((string *)(function.field_2._M_local_buf + 8),(string *)pbVar7);
        std::__cxx11::string::operator+=((string *)(function.field_2._M_local_buf + 8),"\"\n");
      }
      else {
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&extraInclude.field_2 + 8));
        bVar3 = std::operator==(pbVar7,"FUNCTION");
        if (bVar3) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&extraInclude.field_2 + 8));
          local_100._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
          bVar3 = __gnu_cxx::operator==
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&extraInclude.field_2 + 8),&local_100);
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_120,"incorrect arguments to FUNCTION",&local_121);
            cmCommand::SetError(&this->super_cmCommand,&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            std::allocator<char>::~allocator((allocator<char> *)&local_121);
            this_local._7_1_ = 0;
            local_f8 = 1;
            goto LAB_004dd9bd;
          }
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&extraInclude.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)
                     &tests.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pbVar7);
          std::__cxx11::string::operator+=
                    ((string *)
                     &tests.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"(&ac, &av);\n");
        }
        else {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&extraInclude.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c0,pbVar7);
        }
      }
      local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&extraInclude.field_2 + 8),0);
    }
    sourceList = (char *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_c0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_138,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&sourceList);
    extraInclude.field_2._8_8_ = local_138;
    this_00 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(&extraInclude.field_2._M_allocated_capacity + 1);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(this_00);
    local_148 = (char *)std::__cxx11::string::c_str();
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(this_00);
    pbVar7 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(this_00);
    cmsys::SystemTools::GetFilenameExtension(&local_168,pbVar7);
    uVar8 = std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)&local_168);
    if (uVar8 < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_188,"You must specify a file extension for the test driver file.",
                 (allocator *)(driver.field_2._M_local_buf + 0xf));
      cmCommand::SetError(&this->super_cmCommand,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)(driver.field_2._M_local_buf + 0xf));
      this_local._7_1_ = 0;
      local_f8 = 1;
    }
    else {
      pcVar9 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1b0,pcVar9,(allocator *)(configFile.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(configFile.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)local_1b0,"/");
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&extraInclude.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_1b0,(string *)pbVar7);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&extraInclude.field_2 + 8));
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1f8,"CMAKE_ROOT",(allocator *)((long)&testsBegin._M_current + 7));
      pcVar9 = cmMakefile::GetRequiredDefinition(pcVar1,&local_1f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,pcVar9,(allocator *)((long)&testsBegin._M_current + 6))
      ;
      std::allocator<char>::~allocator((allocator<char> *)((long)&testsBegin._M_current + 6));
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&testsBegin._M_current + 7));
      std::__cxx11::string::operator+=(local_1d8,"/Templates/TestDriver.cxx.in");
      uVar2 = extraInclude.field_2._8_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&forwardDeclareCode.field_2 + 8));
      std::__cxx11::string::string(local_240);
      extraInclude.field_2._8_8_ = uVar2;
      while( true ) {
        func_name.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&extraInclude.field_2 + 8),
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&func_name.field_2 + 8));
        if (!bVar3) break;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&extraInclude.field_2 + 8));
        bVar3 = std::operator==(pbVar7,"EXTRA_INCLUDE");
        if (bVar3) break;
        std::__cxx11::string::string((string *)local_268);
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&extraInclude.field_2 + 8));
        cmsys::SystemTools::GetFilenamePath(&local_288,pbVar7);
        bVar4 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_288);
        if (((bVar4 ^ 0xff) & 1) == 0) {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&extraInclude.field_2 + 8));
          cmsys::SystemTools::GetFilenameWithoutLastExtension
                    ((string *)((long)&functionMapCode.field_2 + 8),pbVar7);
          std::__cxx11::string::operator=
                    ((string *)local_268,(string *)(functionMapCode.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(functionMapCode.field_2._M_local_buf + 8));
        }
        else {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&extraInclude.field_2 + 8));
          cmsys::SystemTools::GetFilenamePath(&local_2e8,pbVar7);
          std::operator+(&local_2c8,&local_2e8,"/");
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&extraInclude.field_2 + 8));
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_308,pbVar7);
          std::operator+(&local_2a8,&local_2c8,&local_308);
          std::__cxx11::string::operator=((string *)local_268,(string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2e8);
        }
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_268);
        cmsys::SystemTools::ReplaceString((string *)local_268," ","_");
        cmsys::SystemTools::ReplaceString((string *)local_268,"/","_");
        cmsys::SystemTools::ReplaceString((string *)local_268,":","_");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&forwardDeclareCode.field_2 + 8),(value_type *)local_268);
        std::__cxx11::string::operator+=(local_240,"int ");
        std::__cxx11::string::operator+=(local_240,(string *)local_268);
        std::__cxx11::string::operator+=(local_240,"(int, char*[]);\n");
        std::__cxx11::string::~string((string *)local_268);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&extraInclude.field_2 + 8));
      }
      std::__cxx11::string::string(local_348);
      j._M_current._4_4_ = 0;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&local_358);
      extraInclude.field_2._8_8_ = uVar2;
      local_358._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&forwardDeclareCode.field_2 + 8));
      while( true ) {
        func_name_1.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&extraInclude.field_2 + 8),
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&func_name_1.field_2 + 8));
        if (!bVar3) break;
        std::__cxx11::string::string(local_388);
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&extraInclude.field_2 + 8));
        cmsys::SystemTools::GetFilenamePath(&local_3a8,pbVar7);
        bVar4 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_3a8);
        if (((bVar4 ^ 0xff) & 1) == 0) {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&extraInclude.field_2 + 8));
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_448,pbVar7);
          std::__cxx11::string::operator=(local_388,(string *)&local_448);
          std::__cxx11::string::~string((string *)&local_448);
        }
        else {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&extraInclude.field_2 + 8));
          cmsys::SystemTools::GetFilenamePath(&local_408,pbVar7);
          std::operator+(&local_3e8,&local_408,"/");
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&extraInclude.field_2 + 8));
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_428,pbVar7);
          std::operator+(&local_3c8,&local_3e8,&local_428);
          std::__cxx11::string::operator=(local_388,(string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_408);
        }
        std::__cxx11::string::operator+=(local_348,"  {\n    \"");
        std::__cxx11::string::operator+=(local_348,local_388);
        std::__cxx11::string::operator+=(local_348,"\",\n    ");
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_358);
        std::__cxx11::string::operator+=(local_348,(string *)pbVar10);
        std::__cxx11::string::operator+=(local_348,"\n  },\n");
        j._M_current._4_4_ = j._M_current._4_4_ + 1;
        std::__cxx11::string::~string(local_388);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&extraInclude.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_358);
      }
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_468,"CMAKE_TESTDRIVER_EXTRA_INCLUDES",&local_469);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,&local_468,pcVar9);
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator((allocator<char> *)&local_469);
      }
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_490,"CMAKE_TESTDRIVER_ARGVC_FUNCTION",&local_491);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,&local_490,pcVar9);
        std::__cxx11::string::~string((string *)&local_490);
        std::allocator<char>::~allocator((allocator<char> *)&local_491);
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4b8,"CMAKE_FORWARD_DECLARE_TESTS",&local_4b9);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_4b8,pcVar9);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_4e0,"CMAKE_FUNCTION_TABLE_ENTIRES",
                 (allocator *)(sourceListValue.field_2._M_local_buf + 0xf));
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,(string *)local_4e0,pcVar9);
      std::__cxx11::string::~string((string *)local_4e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(sourceListValue.field_2._M_local_buf + 0xf));
      sourceListValue.field_2._M_local_buf[0xe] = '\x01';
      pcVar1 = (this->super_cmCommand).Makefile;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      outfile = (char *)std::__cxx11::string::c_str();
      cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)((long)&sourceListValue.field_2 + 8));
      iVar5 = cmMakefile::ConfigureFile
                        (pcVar1,pcVar9,outfile,false,true,false,
                         (cmNewLineStyle *)((long)&sourceListValue.field_2 + 8));
      if (iVar5 == 0) {
        sourceListValue.field_2._M_local_buf[0xe] = '\0';
      }
      std::__cxx11::string::string((string *)&sf);
      pcVar11 = cmMakefile::GetOrCreateSource
                          ((this->super_cmCommand).Makefile,(string *)local_1b0,false);
      local_510 = pcVar11;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_530,"ABSTRACT",&local_531);
      cmSourceFile::SetProperty(pcVar11,&local_530,"0");
      std::__cxx11::string::~string((string *)&local_530);
      std::allocator<char>::~allocator((allocator<char> *)&local_531);
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local,1);
      std::__cxx11::string::operator=((string *)&sf,(string *)pvVar12);
      extraInclude.field_2._8_8_ = uVar2;
      while( true ) {
        sf_1 = (cmSourceFile *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c0);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&extraInclude.field_2 + 8),
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&sf_1);
        pcVar9 = local_148;
        if (!bVar3) break;
        pcVar1 = (this->super_cmCommand).Makefile;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&extraInclude.field_2 + 8));
        pcVar11 = cmMakefile::GetOrCreateSource(pcVar1,pbVar7,false);
        local_548 = pcVar11;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_568,"ABSTRACT",&local_569);
        cmSourceFile::SetProperty(pcVar11,&local_568,"0");
        std::__cxx11::string::~string((string *)&local_568);
        std::allocator<char>::~allocator((allocator<char> *)&local_569);
        std::__cxx11::string::operator+=((string *)&sf,";");
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&extraInclude.field_2 + 8));
        std::__cxx11::string::operator+=((string *)&sf,(string *)pbVar7);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&extraInclude.field_2 + 8));
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_590,pcVar9,&local_591);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_590,pcVar9);
      std::__cxx11::string::~string((string *)&local_590);
      std::allocator<char>::~allocator((allocator<char> *)&local_591);
      this_local._7_1_ = sourceListValue.field_2._M_local_buf[0xe] & 1;
      local_f8 = 1;
      std::__cxx11::string::~string((string *)&sf);
      std::__cxx11::string::~string(local_348);
      std::__cxx11::string::~string(local_240);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&forwardDeclareCode.field_2 + 8));
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string((string *)local_1b0);
    }
LAB_004dd9bd:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0);
    std::__cxx11::string::~string
              ((string *)
               &tests.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(function.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCreateTestSourceList
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if (args.size() < 3)
    {
    this->SetError("called with wrong number of arguments.");
    return false;
    }


  std::vector<std::string>::const_iterator i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for(; i != args.end(); i++)
    {
    if(*i == "EXTRA_INCLUDE")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
        }
      extraInclude = "#include \"";
      extraInclude += *i;
      extraInclude += "\"\n";
      }
    else if(*i == "FUNCTION")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("incorrect arguments to FUNCTION");
        return false;
        }
      function = *i;
      function += "(&ac, &av);\n";
      }
    else
      {
      tests.push_back(*i);
      }
    }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2)
    {
    this->SetError(
      "You must specify a file extension for the test driver file.");
    return false;
    }
  std::string driver = this->Makefile->GetCurrentBinaryDirectory();
  driver += "/";
  driver += *i;
  ++i;

  std::string configFile =
    this->Makefile->GetRequiredDefinition("CMAKE_ROOT");

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  std::vector<std::string>::const_iterator testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for(i = testsBegin; i != tests.end(); ++i)
    {
    if(*i == "EXTRA_INCLUDE")
      {
      break;
      }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty())
      {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    else
      {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    cmSystemTools::ReplaceString(func_name, " ", "_");
    cmSystemTools::ReplaceString(func_name, "/", "_");
    cmSystemTools::ReplaceString(func_name, ":", "_");
    tests_func_name.push_back(func_name);
    forwardDeclareCode += "int ";
    forwardDeclareCode += func_name;
    forwardDeclareCode += "(int, char*[]);\n";
    }

  std::string functionMapCode;
  int numTests = 0;
  std::vector<std::string>::iterator j;
  for(i = testsBegin, j = tests_func_name.begin(); i != tests.end(); ++i, ++j)
    {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty())
      {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    else
      {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    functionMapCode += "  {\n"
      "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
      "    ";
    functionMapCode +=  *j;
    functionMapCode += "\n"
      "  },\n";
    numTests++;
    }
  if(!extraInclude.empty())
    {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                                  extraInclude.c_str());
    }
  if(!function.empty())
    {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                                  function.c_str());
    }
  this->Makefile->AddDefinition("CMAKE_FORWARD_DECLARE_TESTS",
    forwardDeclareCode.c_str());
  this->Makefile->AddDefinition("CMAKE_FUNCTION_TABLE_ENTIRES",
    functionMapCode.c_str());
  bool res = true;
  if ( !this->Makefile->ConfigureFile(configFile.c_str(), driver.c_str(),
      false, true, false) )
    {
    res = false;
    }

  // Construct the source list.
  std::string sourceListValue;
  {
  cmSourceFile* sf = this->Makefile->GetOrCreateSource(driver);
  sf->SetProperty("ABSTRACT","0");
  sourceListValue = args[1];
  }
  for(i = testsBegin; i != tests.end(); ++i)
    {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT","0");
    sourceListValue += ";";
    sourceListValue += *i;
    }

  this->Makefile->AddDefinition(sourceList, sourceListValue.c_str());
  return res;
}